

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void parse_type(fb_parser_t *P,fb_value_t *v)

{
  ulong uVar1;
  ushort uVar2;
  fb_token_t *t;
  long lVar3;
  unsigned_short uVar4;
  char *msg;
  int iVar5;
  fb_token_t *pfVar6;
  int iVar7;
  fb_token_t *t_00;
  anon_union_16_9_a0fedaf0_for_fb_value_0 local_48;
  short local_38;
  
  t = P->token;
  v->len = 1;
  v->type = 1;
  t_00 = t;
  iVar7 = 0;
  if (t->id == 0x5b) {
    iVar5 = 0;
    do {
      next(P);
      iVar5 = iVar5 + 1;
      t_00 = P->token;
    } while (t_00->id == 0x5b);
    iVar7 = 1;
    if (iVar5 != 1) {
      __flatcc_error_report
                (P,t,"vector type can only be one-dimensional",(fb_token_t *)0x0,(char *)0x0,0);
      t_00 = P->token;
      iVar7 = iVar5;
    }
  }
  lVar3 = t_00->id;
  uVar1 = lVar3 + 999;
  if (uVar1 < 0x1e) {
    if ((0x25fb4ff7UL >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 != 0x1b) goto LAB_00120522;
      (v->field_0).t = t_00;
      uVar4 = (iVar7 == 0) + 10;
    }
    else {
      (v->field_0).t = t_00;
      uVar4 = (iVar7 == 0) + 8;
    }
    v->type = uVar4;
    next(P);
  }
  else {
LAB_00120522:
    if (lVar3 == 9) {
      parse_ref(P,(fb_ref_t **)v);
      v->type = (iVar7 == 0) + 0xc;
    }
    else if (lVar3 == 0x5d) {
      __flatcc_fb_print_error(P,"error: %s\n","vector type cannot be empty");
      P->failed = P->failed + 1;
    }
    else {
      __flatcc_error_report(P,t_00,"invalid type specifier",(fb_token_t *)0x0,(char *)0x0,0);
    }
  }
  if ((iVar7 == 0) || (P->token->id != 0x3a)) goto LAB_001205e4;
  next(P);
  pfVar6 = P->token;
  parse_value(P,(fb_value_t *)&local_48.s,0,
              "fixed length array length expected to be an unsigned integer");
  if (local_38 != 6) {
    __flatcc_error_report
              (P,pfVar6,"fixed length array length expected to be an unsigned integer",
               (fb_token_t *)0x0,(char *)0x0,0);
    v->type = 1;
    goto LAB_001205e4;
  }
  uVar2 = v->type;
  if (uVar2 < 10) {
    if (uVar2 == 1) goto LAB_001205e4;
    uVar4 = 0x11;
    if (uVar2 == 8) goto LAB_001205a2;
LAB_0012058f:
    msg = "invalid fixed length array type";
    pfVar6 = t_00;
  }
  else {
    if (uVar2 == 10) {
      uVar4 = 0x13;
    }
    else {
      if (uVar2 != 0xc) goto LAB_0012058f;
      uVar4 = 0x12;
    }
LAB_001205a2:
    v->type = uVar4;
    if (local_48.s.s == (char *)0x0) {
      msg = "fixed length array length cannot be 0";
    }
    else {
      if (local_48.u >> 0x20 == 0) {
        v->len = (uint32_t)local_48.i;
        goto LAB_001205e4;
      }
      msg = "fixed length array length overflow";
    }
  }
  __flatcc_error_report(P,pfVar6,msg,(fb_token_t *)0x0,(char *)0x0,0);
  v->type = 1;
LAB_001205e4:
  iVar7 = -iVar7;
  do {
    if (P->token->id != 0x5d) {
      if (iVar7 == 0) goto LAB_00120667;
      break;
    }
    next(P);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1);
  __flatcc_error_report(P,(fb_token_t *)0x0,"vector type missing \']\' to match",t,(char *)0x0,0);
  pfVar6 = P->token;
  if (pfVar6->id == 0x5d) {
    next(P);
    __flatcc_error_report(P,pfVar6,"extra \']\' not matching",t,(char *)0x0,0);
    while (P->token->id == 0x5d) {
      next(P);
    }
  }
LAB_00120667:
  if ((t_00->id == -0x3e5) && ((v->type | 0x10) != 0x11)) {
    __flatcc_error_report
              (P,t_00,"char can only be used as a fixed length array type [char:<n>]",
               (fb_token_t *)0x0,(char *)0x0,0);
    v->type = 1;
  }
  return;
}

Assistant:

static void parse_type(fb_parser_t *P, fb_value_t *v)
{
    fb_token_t *t = 0;
    fb_token_t *ttype = 0;
    fb_token_t *t0 = P->token;
    int vector = 0;

    v->len = 1;
    v->type = vt_invalid;
    while ((t = optional(P, '['))) {
        ++vector;
    }
    if (vector > 1) {
        error_tok(P, t0, "vector type can only be one-dimensional");
    }
    ttype = P->token;
    switch (ttype->id) {
    case tok_kw_int:
    case tok_kw_bool:
    case tok_kw_byte:
    case tok_kw_long:
    case tok_kw_uint:
    case tok_kw_float:
    case tok_kw_short:
    case tok_kw_char:
    case tok_kw_ubyte:
    case tok_kw_ulong:
    case tok_kw_ushort:
    case tok_kw_double:
    case tok_kw_int8:
    case tok_kw_int16:
    case tok_kw_int32:
    case tok_kw_int64:
    case tok_kw_uint8:
    case tok_kw_uint16:
    case tok_kw_uint32:
    case tok_kw_uint64:
    case tok_kw_float32:
    case tok_kw_float64:
        v->t = P->token;
        v->type = vector ? vt_vector_type : vt_scalar_type;
        next(P);
        break;
    case tok_kw_string:
        v->t = P->token;
        v->type = vector ? vt_vector_string_type : vt_string_type;
        next(P);
        break;
    case LEX_TOK_ID:
        parse_ref(P, &v->ref);
        v->type = vector ? vt_vector_type_ref : vt_type_ref;
        break;
    case ']':
        error_tok(P, t, "vector type cannot be empty");
        break;
    default:
        error_tok(P, ttype, "invalid type specifier");
        break;
    }
    if (vector && optional(P, ':')) {
        parse_fixed_array_size(P, ttype, v);
    }
    while (optional(P, ']') && vector--) {
    }
    if (vector) {
        error_tok_2(P, t, "vector type missing ']' to match", t0);
    }
    if ((t = optional(P, ']'))) {
        error_tok_2(P, t, "extra ']' not matching", t0);
        while (optional(P, ']')) {
        }
    }
    if (ttype->id == tok_kw_char && v->type != vt_invalid) {
        if (v->type != vt_fixed_array_type) {
            error_tok(P, ttype, "char can only be used as a fixed length array type [char:<n>]");
            v->type = vt_invalid;
        }
    }
}